

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmd.c
# Opt level: O0

int genmmd_(int *neqns,int_t *xadj,shortint *adjncy,int *invp,int *perm,int_t *delta,shortint *dhead
           ,shortint *qsize,shortint *llist,shortint *marker,int_t *maxint,int_t *nofsub)

{
  int_t iVar1;
  int local_8c;
  int_t local_88;
  int_t num;
  int_t tag;
  int_t nextmd;
  int_t mdnode;
  int_t mdlmt;
  int_t i;
  int_t ehead;
  int_t mdeg;
  int i__1;
  int_t *delta_local;
  int *perm_local;
  int *invp_local;
  shortint *adjncy_local;
  int_t *xadj_local;
  int *neqns_local;
  
  delta_local = perm + -1;
  perm_local = invp + -1;
  invp_local = adjncy + -1;
  adjncy_local = xadj + -1;
  if (0 < *neqns) {
    *nofsub = 0;
    _mdeg = delta;
    xadj_local = neqns;
    slu_mmdint_(neqns,xadj,adjncy,dhead,invp,perm,qsize,llist,marker);
    local_8c = 1;
    num = *dhead;
    while (0 < num) {
      tag = num;
      iVar1 = perm_local[num];
      marker[(long)num + -1] = *maxint;
      perm_local[num] = -local_8c;
      local_8c = local_8c + 1;
      num = iVar1;
    }
    if (local_8c <= *xadj_local) {
      local_88 = 1;
      *dhead = 0;
      i = 2;
      do {
        while (dhead[(long)i + -1] < 1) {
          i = i + 1;
        }
        nextmd = i + *_mdeg;
        mdlmt = 0;
        do {
          while (tag = dhead[(long)i + -1], tag < 1) {
            i = i + 1;
            if (nextmd < i) goto LAB_00116f61;
          }
          num = perm_local[tag];
          dhead[(long)i + -1] = num;
          if (0 < num) {
            delta_local[num] = -i;
          }
          perm_local[tag] = -local_8c;
          *nofsub = *nofsub + i + qsize[(long)tag + -1] + -2;
          if (*xadj_local < local_8c + qsize[(long)tag + -1]) goto LAB_00116ffd;
          local_88 = local_88 + 1;
          if (*maxint <= local_88) {
            local_88 = 1;
            ehead = *xadj_local;
            for (mdnode = 1; mdnode <= ehead; mdnode = mdnode + 1) {
              if (marker[(long)mdnode + -1] < *maxint) {
                marker[(long)mdnode + -1] = 0;
              }
            }
          }
          slu_mmdelm_(&tag,adjncy_local + 1,invp_local + 1,dhead,perm_local + 1,delta_local + 1,
                      qsize,llist,marker,maxint,&local_88);
          local_8c = qsize[(long)tag + -1] + local_8c;
          llist[(long)tag + -1] = mdlmt;
          mdlmt = tag;
        } while (-1 < *_mdeg);
LAB_00116f61:
        if (*xadj_local < local_8c) break;
        slu_mmdupd_(&mdlmt,xadj_local,adjncy_local + 1,invp_local + 1,_mdeg,&i,dhead,perm_local + 1,
                    delta_local + 1,qsize,llist,marker,maxint,&local_88);
      } while( true );
    }
LAB_00116ffd:
    slu_mmdnum_(xadj_local,delta_local + 1,perm_local + 1,qsize);
  }
  return 0;
}

Assistant:

int genmmd_(int *neqns, int_t *xadj, shortint *adjncy, 
	int *invp, int *perm, int_t *delta, shortint *dhead, 
	shortint *qsize, shortint *llist, shortint *marker, int_t *maxint, 
	int_t *nofsub)
{
    /* System generated locals */
    int i__1;

    /* Local variables */
    int_t mdeg, ehead, i, mdlmt, mdnode;
    extern /* Subroutine */
    int slu_mmdelm_(const int_t *mdnode, int_t *xadj, shortint *adjncy,
                    shortint *dhead, int *dforw, int *dbakw, shortint *qsize,
                    shortint *llist, shortint *marker, const int_t *maxint, const int_t *tag),
    slu_mmdupd_(const int_t *ehead, const int *neqns, int_t *xadj,
                shortint *adjncy, const int_t *delta, int_t *mdeg, shortint *dhead,
                int *dforw, int *dbakw, shortint *qsize, shortint *llist,
                shortint *marker, const int_t *maxint, int_t *tag),
    slu_mmdint_(const int *neqns, int_t *xadj, shortint *adjncy,
                shortint *dhead, int *dforw, int *dbakw, shortint *qsize,
                shortint *llist, shortint *marker),
    slu_mmdnum_(const int *neqns, int *perm, int *invp, shortint *qsize);

    int_t nextmd, tag, num;

/* *************************************************************** */


/* *************************************************************** */

    /* Parameter adjustments */
    --marker;
    --llist;
    --qsize;
    --dhead;
    --perm;
    --invp;
    --adjncy;
    --xadj;

    /* Function Body */
    if (*neqns <= 0) {
	return 0;
    }

/*        ------------------------------------------------ */
/*        INITIALIZATION FOR THE MINIMUM DEGREE ALGORITHM. */
/*        ------------------------------------------------ */
    *nofsub = 0;
    slu_mmdint_(neqns, &xadj[1], &adjncy[1], &dhead[1], &invp[1], &perm[1], &
	    qsize[1], &llist[1], &marker[1]);

/*        ---------------------------------------------- */
/*        NUM COUNTS THE NUMBER OF ORDERED NODES PLUS 1. */
/*        ---------------------------------------------- */
    num = 1;

/*        ----------------------------- */
/*        ELIMINATE ALL ISOLATED NODES. */
/*        ----------------------------- */
    nextmd = dhead[1];
L100:
    if (nextmd <= 0) {
	goto L200;
    }
    mdnode = nextmd;
    nextmd = invp[mdnode];
    marker[mdnode] = *maxint;
    invp[mdnode] = -num;
    ++num;
    goto L100;

L200:
/*        ---------------------------------------- */
/*        SEARCH FOR NODE OF THE MINIMUM DEGREE. */
/*        MDEG IS THE CURRENT MINIMUM DEGREE; */
/*        TAG IS USED TO FACILITATE MARKING NODES. */
/*        ---------------------------------------- */
    if (num > *neqns) {
	goto L1000;
    }
    tag = 1;
    dhead[1] = 0;
    mdeg = 2;
L300:
    if (dhead[mdeg] > 0) {
	goto L400;
    }
    ++mdeg;
    goto L300;
L400:
/*            ------------------------------------------------- */
/*            USE VALUE OF DELTA TO SET UP MDLMT, WHICH GOVERNS */
/*            WHEN A DEGREE UPDATE IS TO BE PERFORMED. */
/*            ------------------------------------------------- */
    mdlmt = mdeg + *delta;
    ehead = 0;

L500:
    mdnode = dhead[mdeg];
    if (mdnode > 0) {
	goto L600;
    }
    ++mdeg;
    if (mdeg > mdlmt) {
	goto L900;
    }
    goto L500;
L600:
/*                ---------------------------------------- */
/*                REMOVE MDNODE FROM THE DEGREE STRUCTURE. */
/*                ---------------------------------------- */
    nextmd = invp[mdnode];
    dhead[mdeg] = nextmd;
    if (nextmd > 0) {
	perm[nextmd] = -mdeg;
    }
    invp[mdnode] = -num;
    *nofsub = *nofsub + mdeg + qsize[mdnode] - 2;
    if (num + qsize[mdnode] > *neqns) {
	goto L1000;
    }
/*                ---------------------------------------------- */
/*                ELIMINATE MDNODE AND PERFORM QUOTIENT GRAPH */
/*                TRANSFORMATION.  RESET TAG VALUE IF NECESSARY. */
/*                ---------------------------------------------- */
    ++tag;
    if (tag < *maxint) {
	goto L800;
    }
    tag = 1;
    i__1 = *neqns;
    for (i = 1; i <= i__1; ++i) {
	if (marker[i] < *maxint) {
	    marker[i] = 0;
	}
/* L700: */
    }
L800:
    slu_mmdelm_(&mdnode, &xadj[1], &adjncy[1], &dhead[1], &invp[1], &perm[1], &
	    qsize[1], &llist[1], &marker[1], maxint, &tag);
    num += qsize[mdnode];
    llist[mdnode] = ehead;
    ehead = mdnode;
    if (*delta >= 0) {
	goto L500;
    }
L900:
/*            ------------------------------------------- */
/*            UPDATE DEGREES OF THE NODES INVOLVED IN THE */
/*            MINIMUM DEGREE NODES ELIMINATION. */
/*            ------------------------------------------- */
    if (num > *neqns) {
	goto L1000;
    }
    slu_mmdupd_(&ehead, neqns, &xadj[1], &adjncy[1], delta, &mdeg, &dhead[1], &
	    invp[1], &perm[1], &qsize[1], &llist[1], &marker[1], maxint, &tag)
	    ;
    goto L300;

L1000:
    slu_mmdnum_(neqns, &perm[1], &invp[1], &qsize[1]);
    return 0;

}